

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDVertex::CompareUnorderedFaces(ON_SubDVertex *a,ON_SubDVertex *b)

{
  ushort uVar1;
  int iVar2;
  
  if (a == (ON_SubDVertex *)0x0) {
    return -(uint)(b != (ON_SubDVertex *)0x0);
  }
  iVar2 = 1;
  if (b != (ON_SubDVertex *)0x0) {
    uVar1 = a->m_face_count;
    iVar2 = -1;
    if ((b->m_face_count <= uVar1) && (iVar2 = 1, uVar1 <= b->m_face_count)) {
      iVar2 = ComparePointerArrays
                        ((ulong)uVar1,(ON__UINT_PTR *)a->m_faces,(ON__UINT_PTR *)b->m_faces);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int ON_SubDVertex::CompareUnorderedFaces(
  const ON_SubDVertex* a,
  const ON_SubDVertex* b
  )
{
  if (nullptr == a)
    return ((nullptr == b) ? 0 : -1);
  if (nullptr == b)
    return 1;

  if (a->m_face_count < b->m_face_count)
    return -1;
  if (a->m_face_count > b->m_face_count)
    return 1;
  return ComparePointerArrays(a->m_face_count, (const ON__UINT_PTR*)a->m_faces, (const ON__UINT_PTR*)b->m_faces);
}